

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O2

REF_STATUS ref_mpi_min(REF_MPI ref_mpi,void *input,void *output,REF_TYPE type)

{
  if (type == 3) {
    *(undefined8 *)output = *input;
  }
  else {
    if (type != 1) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x2d4,
             "ref_mpi_min",6,"data type");
      return 6;
    }
    *(undefined4 *)output = *input;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_min(REF_MPI ref_mpi, void *input, void *output,
                               REF_TYPE type) {
#ifdef HAVE_MPI
  MPI_Datatype datatype;

  if (!ref_mpi_para(ref_mpi)) {
    switch (type) {
      case REF_INT_TYPE:
        *(REF_INT *)output = *(REF_INT *)input;
        break;
      case REF_DBL_TYPE:
        *(REF_DBL *)output = *(REF_DBL *)input;
        break;
      default:
        RSS(REF_IMPLEMENT, "data type");
    }
    return REF_SUCCESS;
  }
  ref_type_mpi_type(type, datatype);

  ref_mpi_where_am_i(ref_mpi);
  MPI_Reduce(input, output, 1, datatype, MPI_MIN, 0, ref_mpi_comm(ref_mpi));

#else
  switch (type) {
    case REF_INT_TYPE:
      *(REF_INT *)output = *(REF_INT *)input;
      break;
    case REF_DBL_TYPE:
      *(REF_DBL *)output = *(REF_DBL *)input;
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }
  SUPRESS_UNUSED_COMPILER_WARNING(ref_mpi);
#endif

  return REF_SUCCESS;
}